

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefs.c
# Opt level: O0

void Abc_NodeMffcConeSupp(Abc_Obj_t *pNode,Vec_Ptr_t *vCone,Vec_Ptr_t *vSupp)

{
  int iVar1;
  Vec_Ptr_t *vSupp_local;
  Vec_Ptr_t *vCone_local;
  Abc_Obj_t *pNode_local;
  
  iVar1 = Abc_ObjIsNode(pNode);
  if (iVar1 == 0) {
    __assert_fail("Abc_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcRefs.c"
                  ,0x12d,"void Abc_NodeMffcConeSupp(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  iVar1 = Abc_ObjIsComplement(pNode);
  if (iVar1 == 0) {
    if (vCone != (Vec_Ptr_t *)0x0) {
      Vec_PtrClear(vCone);
    }
    if (vSupp != (Vec_Ptr_t *)0x0) {
      Vec_PtrClear(vSupp);
    }
    Abc_NtkIncrementTravId(pNode->pNtk);
    Abc_NodeMffcConeSupp_rec(pNode,vCone,vSupp,1);
    return;
  }
  __assert_fail("!Abc_ObjIsComplement(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcRefs.c"
                ,0x12e,"void Abc_NodeMffcConeSupp(Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
}

Assistant:

void Abc_NodeMffcConeSupp( Abc_Obj_t * pNode, Vec_Ptr_t * vCone, Vec_Ptr_t * vSupp )
{
    assert( Abc_ObjIsNode(pNode) );
    assert( !Abc_ObjIsComplement(pNode) );
    if ( vCone ) Vec_PtrClear( vCone );
    if ( vSupp ) Vec_PtrClear( vSupp );
    Abc_NtkIncrementTravId( pNode->pNtk );
    Abc_NodeMffcConeSupp_rec( pNode, vCone, vSupp, 1 );
//    printf( "\n" );
}